

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall re2::Compiler::Quest(Compiler *this,Frag a,bool nongreedy)

{
  uint uVar1;
  PatchList PVar2;
  Frag FVar3;
  ulong uVar4;
  Inst *this_00;
  uint32_t out;
  
  out = a.begin;
  if (out == 0) {
    FVar3 = Nop(this);
    uVar4 = (ulong)FVar3 >> 0x20;
  }
  else {
    uVar1 = AllocInst(this,1);
    if ((int)uVar1 < 0) {
      uVar4 = 0;
      FVar3.begin = 0;
      FVar3.end.p = 0;
    }
    else {
      FVar3.end.p = 0;
      FVar3.begin = uVar1;
      this_00 = (this->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar1;
      PVar2.p = uVar1 * 2;
      if (nongreedy) {
        Prog::Inst::InitAlt(this_00,0,out);
      }
      else {
        Prog::Inst::InitAlt(this_00,out,0);
        PVar2.p = PVar2.p | 1;
      }
      PVar2 = PatchList::Append((this->inst_).ptr_._M_t.
                                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,PVar2,
                                a.end.p);
      uVar4 = (ulong)PVar2.p;
    }
  }
  return (Frag)((ulong)FVar3 & 0xffffffff | uVar4 << 0x20);
}

Assistant:

Frag Compiler::Quest(Frag a, bool nongreedy) {
  if (IsNoMatch(a))
    return Nop();
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  return Frag(id, PatchList::Append(inst_.data(), pl, a.end));
}